

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

expression_ptr __thiscall
mjs::parser::
make_expression<mjs::binary_expression,mjs::token_type_const&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
          (parser *this,token_type *args,
          unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_1,
          unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_2)

{
  long *plVar1;
  element_type *this_00;
  expression_ptr *in_R8;
  source_extend local_48;
  
  plVar1 = *(long **)(args + 0x1a);
  if (plVar1 != (long *)0x0) {
    this_00 = (element_type *)operator_new(0x38);
    local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)*plVar1;
    local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((undefined8 *)*plVar1)[1];
    if (local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_48.start = *(uint32_t *)(plVar1 + 3);
    local_48.end = *(uint32_t *)(*plVar1 + 100);
    binary_expression::binary_expression
              ((binary_expression *)this_00,&local_48,
               *(token_type *)
                &(args_1->_M_t).
                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,args_2,in_R8);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_00;
    if (local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
           (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
  }
  __assert_fail("expression_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x13d,
                "expression_ptr mjs::parser::make_expression(Args &&...) [T = mjs::binary_expression, Args = <const mjs::token_type &, std::unique_ptr<mjs::expression>, std::unique_ptr<mjs::expression>>]"
               );
}

Assistant:

expression_ptr make_expression(Args&&... args) {
        assert(expression_pos_);
        auto e = expression_ptr{new T{expression_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << e->extend() << " Producting: " << *e << "\n";
#endif
        return e;
    }